

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::Unlink(PF_BufferMgr *this,int slot)

{
  int iVar1;
  PF_BufPageDesc *pPVar2;
  
  if (this->first == slot) {
    this->first = this->bufTable[slot].next;
  }
  if (this->last == slot) {
    this->last = this->bufTable[slot].prev;
  }
  pPVar2 = this->bufTable;
  iVar1 = pPVar2[slot].next;
  if ((long)iVar1 != -1) {
    pPVar2[iVar1].prev = pPVar2[slot].prev;
  }
  if ((long)pPVar2[slot].prev != -1) {
    pPVar2[pPVar2[slot].prev].next = iVar1;
  }
  pPVar2[slot].next = -1;
  pPVar2[slot].prev = -1;
  return 0;
}

Assistant:

RC PF_BufferMgr::Unlink(int slot)
{
   // If slot is at head of list, set first to next element
   if (first == slot)
      first = bufTable[slot].next;

   // If slot is at end of list, set last to previous element
   if (last == slot)
      last = bufTable[slot].prev;

   // If slot not at end of list, point next back to previous
   if (bufTable[slot].next != INVALID_SLOT)
      bufTable[bufTable[slot].next].prev = bufTable[slot].prev;

   // If slot not at head of list, point prev forward to next
   if (bufTable[slot].prev != INVALID_SLOT)
      bufTable[bufTable[slot].prev].next = bufTable[slot].next;

   // Set next and prev pointers of slot entry
   bufTable[slot].prev = bufTable[slot].next = INVALID_SLOT;

   // Return ok
   return (0);
}